

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_def.c
# Opt level: O0

_Bool upb_EnumDef_MiniDescriptorEncode(upb_EnumDef *e,upb_Arena *a,upb_StringView *out)

{
  _Bool _Var1;
  uint32_t val;
  upb_EnumValueDef *local_88;
  int local_78;
  uint32_t current;
  int i;
  uint32_t previous;
  upb_EnumValueDef **sorted;
  upb_DescState s;
  upb_StringView *out_local;
  upb_Arena *a_local;
  upb_EnumDef *e_local;
  
  s.ptr = (char *)out;
  _upb_DescState_Init((upb_DescState *)&sorted);
  _i = (upb_EnumValueDef **)0x0;
  if (((e->is_sorted & 1U) == 0) &&
     (_i = _upb_EnumValueDefs_Sorted(e->values,e->value_count,a), _i == (upb_EnumValueDef **)0x0)) {
    e_local._7_1_ = false;
  }
  else {
    _Var1 = _upb_DescState_Grow((upb_DescState *)&sorted,a);
    if (_Var1) {
      s.buf = upb_MtDataEncoder_StartEnum((upb_MtDataEncoder *)&sorted,s.buf);
      current = 0;
      for (local_78 = 0; local_78 < e->value_count; local_78 = local_78 + 1) {
        if (_i == (upb_EnumValueDef **)0x0) {
          local_88 = upb_EnumDef_Value(e,local_78);
        }
        else {
          local_88 = _i[local_78];
        }
        val = upb_EnumValueDef_Number(local_88);
        if ((local_78 == 0) || (current != val)) {
          _Var1 = _upb_DescState_Grow((upb_DescState *)&sorted,a);
          if (!_Var1) {
            return false;
          }
          s.buf = upb_MtDataEncoder_PutEnumValue((upb_MtDataEncoder *)&sorted,s.buf,val);
          current = val;
        }
      }
      _Var1 = _upb_DescState_Grow((upb_DescState *)&sorted,a);
      if (_Var1) {
        s.buf = upb_MtDataEncoder_EndEnum((upb_MtDataEncoder *)&sorted,s.buf);
        if ((char *)(s.bufsize + s.e.internal._24_8_) <= s.buf) {
          __assert_fail("s.ptr < s.buf + s.bufsize",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/reflection/enum_def.c"
                        ,0xcc,
                        "_Bool upb_EnumDef_MiniDescriptorEncode(const upb_EnumDef *, upb_Arena *, upb_StringView *)"
                       );
        }
        *s.buf = '\0';
        *(size_t *)s.ptr = s.bufsize;
        *(size_t *)(s.ptr + 8) = (long)s.buf - s.bufsize;
        e_local._7_1_ = true;
      }
      else {
        e_local._7_1_ = false;
      }
    }
    else {
      e_local._7_1_ = false;
    }
  }
  return e_local._7_1_;
}

Assistant:

bool upb_EnumDef_MiniDescriptorEncode(const upb_EnumDef* e, upb_Arena* a,
                                      upb_StringView* out) {
  upb_DescState s;
  _upb_DescState_Init(&s);

  const upb_EnumValueDef** sorted = NULL;
  if (!e->is_sorted) {
    sorted = _upb_EnumValueDefs_Sorted(e->values, e->value_count, a);
    if (!sorted) return false;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  s.ptr = upb_MtDataEncoder_StartEnum(&s.e, s.ptr);

  // Duplicate values are allowed but we only encode each value once.
  uint32_t previous = 0;

  for (int i = 0; i < e->value_count; i++) {
    const uint32_t current =
        upb_EnumValueDef_Number(sorted ? sorted[i] : upb_EnumDef_Value(e, i));
    if (i != 0 && previous == current) continue;

    if (!_upb_DescState_Grow(&s, a)) return false;
    s.ptr = upb_MtDataEncoder_PutEnumValue(&s.e, s.ptr, current);
    previous = current;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  s.ptr = upb_MtDataEncoder_EndEnum(&s.e, s.ptr);

  // There will always be room for this '\0' in the encoder buffer because
  // kUpb_MtDataEncoder_MinSize is overkill for upb_MtDataEncoder_EndEnum().
  UPB_ASSERT(s.ptr < s.buf + s.bufsize);
  *s.ptr = '\0';

  out->data = s.buf;
  out->size = s.ptr - s.buf;
  return true;
}